

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_duplex.cpp
# Opt level: O2

void device_collection_changed_callback(cubeb *context,void *user)

{
  Message *message;
  AssertHelper AStack_58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertionResult gtest_ar_;
  String local_38;
  
  fwrite("collection changed callback\n",0x1c,1,_stderr);
  gtest_ar_.success_ = false;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  testing::Message::Message((Message *)&local_50);
  message = testing::Message::operator<<
                      ((Message *)&local_50,
                       (char (*) [71])
                       "Error: device collection changed callback called when opening a stream");
  testing::internal::GetBoolAssertionFailureMessage
            ((internal *)&local_38,&gtest_ar_,"false","false","true");
  testing::internal::AssertHelper::AssertHelper
            (&AStack_58,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_duplex.cpp"
             ,0x88,local_38.c_str_);
  testing::internal::AssertHelper::operator=(&AStack_58,message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_58);
  testing::internal::String::~String(&local_38);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_50);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

void device_collection_changed_callback(cubeb * context, void * user)
{
  fprintf(stderr, "collection changed callback\n");
  ASSERT_TRUE(false) << "Error: device collection changed callback"
                        " called when opening a stream";
}